

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  bool bVar1;
  Arena *pAVar2;
  Arena *rhs;
  LogMessage *pLVar3;
  undefined1 local_50 [8];
  RepeatedPtrFieldBase temp;
  LogMessage local_30;
  Voidify local_19;
  RepeatedPtrFieldBase *local_18;
  RepeatedPtrFieldBase *other_local;
  RepeatedPtrFieldBase *this_local;
  
  local_18 = other;
  other_local = this;
  pAVar2 = GetArena(this);
  rhs = GetArena(local_18);
  bVar1 = CanUseInternalSwap(pAVar2,rhs);
  temp.arena_._7_1_ = 0;
  if (bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x226,"!internal::CanUseInternalSwap(GetArena(), other->GetArena())");
    temp.arena_._7_1_ = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  }
  if ((temp.arena_._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  pAVar2 = GetArena(local_18);
  RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_50,pAVar2);
  bVar1 = empty(this);
  if (!bVar1) {
    MergeFrom<proto2_unittest::TestAllTypes>((RepeatedPtrFieldBase *)local_50,this);
  }
  CopyFrom<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
            (this,local_18);
  InternalSwap(local_18,(RepeatedPtrFieldBase *)local_50);
  bVar1 = NeedsDestroy((RepeatedPtrFieldBase *)local_50);
  if (bVar1) {
    Destroy<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
              ((RepeatedPtrFieldBase *)local_50);
  }
  ~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_50);
  return;
}

Assistant:

PROTOBUF_NOINLINE void SwapFallback(RepeatedPtrFieldBase* other) {
    ABSL_DCHECK(!internal::CanUseInternalSwap(GetArena(), other->GetArena()));

    // Copy semantics in this case. We try to improve efficiency by placing the
    // temporary on |other|'s arena so that messages are copied twice rather
    // than three times.
    RepeatedPtrFieldBase temp(other->GetArena());
    if (!this->empty()) {
      temp.MergeFrom<typename TypeHandler::Type>(*this);
    }
    this->CopyFrom<TypeHandler>(*other);
    other->InternalSwap(&temp);
    if (temp.NeedsDestroy()) {
      temp.Destroy<TypeHandler>();
    }
  }